

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void funcargs(LexState *ls,expdesc *f,int line)

{
  FuncState *fs;
  int iVar1;
  int iVar2;
  expdesc args;
  
  fs = ls->fs;
  iVar2 = (ls->t).token;
  if (iVar2 == 0x121) {
    args.u.info = luaK_stringK(fs,(ls->t).seminfo.ts);
    args.t = -1;
    args.f = -1;
    args.k = VK;
    luaX_next(ls);
    iVar2 = (f->u).info;
LAB_0010df1b:
    luaK_exp2nextreg(fs,&args);
  }
  else {
    if (iVar2 == 0x7b) {
      constructor(ls,&args);
    }
    else {
      if (iVar2 != 0x28) {
        luaX_syntaxerror(ls,"function arguments expected");
      }
      luaX_next(ls);
      if ((ls->t).token == 0x29) {
        args.k = VVOID;
      }
      else {
        explist(ls,&args);
        luaK_setreturns(fs,&args,-1);
      }
      check_match(ls,0x29,0x28,line);
    }
    iVar2 = (f->u).info;
    iVar1 = 0;
    if ((args.k & ~VNIL) == VCALL) goto LAB_0010df2f;
    if (args.k != VVOID) goto LAB_0010df1b;
  }
  iVar1 = (uint)fs->freereg - iVar2;
LAB_0010df2f:
  iVar1 = luaK_codeABC(fs,OP_CALL,iVar2,iVar1,2);
  f->t = -1;
  f->f = -1;
  f->k = VCALL;
  (f->u).info = iVar1;
  luaK_fixline(fs,line);
  fs->freereg = (char)iVar2 + '\x01';
  return;
}

Assistant:

static void funcargs (LexState *ls, expdesc *f, int line) {
  FuncState *fs = ls->fs;
  expdesc args;
  int base, nparams;
  switch (ls->t.token) {
    case '(': {  /* funcargs -> `(' [ explist ] `)' */
      luaX_next(ls);
      if (ls->t.token == ')')  /* arg list is empty? */
        args.k = VVOID;
      else {
        explist(ls, &args);
        luaK_setmultret(fs, &args);
      }
      check_match(ls, ')', '(', line);
      break;
    }
    case '{': {  /* funcargs -> constructor */
      constructor(ls, &args);
      break;
    }
    case TK_STRING: {  /* funcargs -> STRING */
      codestring(ls, &args, ls->t.seminfo.ts);
      luaX_next(ls);  /* must use `seminfo' before `next' */
      break;
    }
    default: {
      luaX_syntaxerror(ls, "function arguments expected");
    }
  }
  lua_assert(f->k == VNONRELOC);
  base = f->u.info;  /* base register for call */
  if (hasmultret(args.k))
    nparams = LUA_MULTRET;  /* open call */
  else {
    if (args.k != VVOID)
      luaK_exp2nextreg(fs, &args);  /* close last argument */
    nparams = fs->freereg - (base+1);
  }
  init_exp(f, VCALL, luaK_codeABC(fs, OP_CALL, base, nparams+1, 2));
  luaK_fixline(fs, line);
  fs->freereg = base+1;  /* call remove function and arguments and leaves
                            (unless changed) one result */
}